

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_program
clLinkProgram(cl_context context,cl_uint num_devices,cl_device_id *device_list,char *options,
             cl_uint num_input_programs,cl_program *input_programs,
             _func_void_cl_program_void_ptr *pfn_notify,void *user_data,cl_int *errcode_ret)

{
  bool bVar1;
  cl_icd_dispatch *pcVar2;
  ulong uVar3;
  SConfig *pSVar4;
  CLIntercept *in_RCX;
  cl_device_id *in_RDX;
  cl_uint in_ESI;
  cl_context in_RDI;
  cl_uint in_R8D;
  __pthread_internal_list *in_R9;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_00000008;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_00000010;
  CLIntercept *in_stack_00000018;
  cl_int in_stack_00000064;
  char *in_stack_00000068;
  CLIntercept *in_stack_00000070;
  char *in_stack_00000080;
  cl_bool in_stack_0000008c;
  cl_bool in_stack_00000090;
  bool in_stack_00000097;
  cl_program in_stack_00000098;
  CLIntercept *in_stack_000000a0;
  cl_program retVal;
  cl_program in_stack_00000128;
  time_point cpuEnd;
  time_point cpuStart;
  time_point buildTimeStart;
  cl_int localErrorCode;
  bool modified;
  char *newOptions;
  bool isLink;
  bool isCompile;
  uint64_t enqueueCounter;
  CLIntercept *pIntercept;
  cl_device_id *in_stack_00000260;
  cl_uint in_stack_0000026c;
  cl_program in_stack_00000270;
  CLIntercept *in_stack_00000278;
  time_point in_stack_00000280;
  undefined8 in_stack_fffffffffffffe48;
  undefined4 uVar5;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffe50;
  CLIntercept *in_stack_fffffffffffffe58;
  CLIntercept *in_stack_fffffffffffffe60;
  CObjectTracker *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  cl_program in_stack_fffffffffffffe78;
  CLIntercept *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  CLIntercept *in_stack_fffffffffffffe90;
  cl_program in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  int local_12c;
  rep local_128;
  allocator in_stack_fffffffffffffeef;
  string *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  CLIntercept *in_stack_ffffffffffffff00;
  time_point in_stack_ffffffffffffff08;
  time_point in_stack_ffffffffffffff10;
  allocator local_c1;
  string local_c0 [32];
  rep local_a0;
  cl_program local_98;
  uint64_t local_90;
  time_point local_88;
  time_point local_80;
  CLIntercept *local_78;
  CLIntercept *local_70;
  undefined4 local_68;
  byte local_61;
  undefined8 local_60;
  undefined1 local_52;
  undefined1 local_51;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  uVar5 = (undefined4)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  local_40 = in_R9;
  local_48 = GetIntercept();
  if (((CLIntercept *)local_48 == (CLIntercept *)0x0) ||
     (pcVar2 = CLIntercept::dispatch((CLIntercept *)local_48),
     pcVar2->clLinkProgram == (cl_api_clLinkProgram)0x0)) {
    local_12c = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_12c);
    if (in_stack_00000018 != (CLIntercept *)0x0) {
      *(cl_int *)&in_stack_00000018->m_ProcessId = -0x22;
    }
    local_98 = (cl_program)0x0;
  }
  else {
    local_50 = CLIntercept::getEnqueueCounter(in_stack_fffffffffffffe58);
    local_51 = '\0';
    local_52 = '\x01';
    local_60 = (CLIntercept *)0x0;
    local_61 = 0;
    CLIntercept::config((CLIntercept *)local_48);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      CLIntercept::config((CLIntercept *)local_48);
      std::__cxx11::string::c_str();
      bVar1 = CLIntercept::appendBuildOptions
                        (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                         (char *)in_stack_fffffffffffffe80,(char **)in_stack_fffffffffffffe78);
      local_61 = (local_61 & 1) != 0 || bVar1;
    }
    pSVar4 = CLIntercept::config((CLIntercept *)local_48);
    if (((pSVar4->RelaxAllocationLimits & 1U) != 0) &&
       (bVar1 = CLIntercept::checkRelaxAllocationLimitsSupport
                          (in_stack_fffffffffffffe80,
                           (cl_uint)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                           (cl_device_id *)in_stack_fffffffffffffe70), bVar1)) {
      bVar1 = CLIntercept::appendBuildOptions
                        (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                         (char *)in_stack_fffffffffffffe80,(char **)in_stack_fffffffffffffe78);
      local_61 = (local_61 & 1) != 0 || bVar1;
    }
    pSVar4 = CLIntercept::config((CLIntercept *)local_48);
    if ((pSVar4->CallLogging & 1U) != 0) {
      in_stack_fffffffffffffe50 = in_stack_00000008;
      CLIntercept::callLoggingEnter
                ((CLIntercept *)local_48,"clLinkProgram",local_50,(cl_kernel)0x0,
                 "context = %p, num_input_programs = %u, pfn_notify = %p",in_RDI,
                 CONCAT44(uVar5,in_R8D));
    }
    local_68 = 0;
    pSVar4 = CLIntercept::config((CLIntercept *)local_48);
    if ((((((pSVar4->CallLogging & 1U) != 0) ||
          (pSVar4 = CLIntercept::config((CLIntercept *)local_48), (pSVar4->ErrorLogging & 1U) != 0))
         || (pSVar4 = CLIntercept::config((CLIntercept *)local_48), (pSVar4->ErrorAssert & 1U) != 0)
         ) || (pSVar4 = CLIntercept::config((CLIntercept *)local_48), (pSVar4->NoErrors & 1U) != 0))
       && (in_stack_00000018 == (CLIntercept *)0x0)) {
      in_stack_00000018 = (CLIntercept *)&stack0xffffffffffffff98;
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffe50);
    pSVar4 = CLIntercept::config((CLIntercept *)local_48);
    if ((pSVar4->BuildLogging & 1U) != 0) {
      local_78 = (CLIntercept *)std::chrono::_V2::steady_clock::now();
      local_70 = local_78;
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffe50);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffe50);
    pSVar4 = CLIntercept::config((CLIntercept *)local_48);
    if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
       (pSVar4 = CLIntercept::config((CLIntercept *)local_48), (pSVar4->ChromeCallLogging & 1U) != 0
       )) {
      local_90 = std::chrono::_V2::steady_clock::now();
      local_80.__d.__r = (duration)(duration)local_90;
    }
    local_98 = (cl_program)0x0;
    if ((CLIntercept *)local_60 != (CLIntercept *)0x0) {
      pcVar2 = CLIntercept::dispatch((CLIntercept *)local_48);
      in_stack_fffffffffffffe50 = in_stack_00000010;
      in_stack_fffffffffffffe58 = in_stack_00000018;
      local_98 = (*pcVar2->clLinkProgram)
                           (in_RDI,in_ESI,in_RDX,(char *)local_60,in_R8D,(cl_program *)local_40,
                            (_func_void_cl_program_void_ptr *)in_stack_00000008,in_stack_00000010,
                            (cl_int *)in_stack_00000018);
    }
    if (local_98 == (cl_program)0x0) {
      pcVar2 = CLIntercept::dispatch((CLIntercept *)local_48);
      in_stack_fffffffffffffe58 = in_stack_00000018;
      local_98 = (*pcVar2->clLinkProgram)
                           (in_RDI,in_ESI,in_RDX,(char *)in_RCX,in_R8D,(cl_program *)local_40,
                            (_func_void_cl_program_void_ptr *)in_stack_00000008,in_stack_00000010,
                            (cl_int *)in_stack_00000018);
      in_stack_fffffffffffffe50 = in_stack_00000010;
    }
    pSVar4 = CLIntercept::config((CLIntercept *)local_48);
    if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
       (pSVar4 = CLIntercept::config((CLIntercept *)local_48), (pSVar4->ChromeCallLogging & 1U) != 0
       )) {
      local_a0 = std::chrono::_V2::steady_clock::now();
      local_88.__d.__r = (duration)(duration)local_a0;
      pSVar4 = CLIntercept::config((CLIntercept *)local_48);
      if (((pSVar4->HostPerformanceTiming & 1U) != 0) &&
         (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                            ((CLIntercept *)local_48,local_50), bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c0,"",&local_c1);
        CLIntercept::updateHostTimingStats
                  ((CLIntercept *)in_stack_ffffffffffffff10.__d.__r,
                   (char *)in_stack_ffffffffffffff08.__d.__r,(string *)in_stack_ffffffffffffff00,
                   local_80,local_88);
        std::__cxx11::string::~string(local_c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      }
    }
    pSVar4 = CLIntercept::config((CLIntercept *)local_48);
    if (((((pSVar4->ErrorLogging & 1U) != 0) ||
         (pSVar4 = CLIntercept::config((CLIntercept *)local_48), (pSVar4->ErrorAssert & 1U) != 0))
        || (pSVar4 = CLIntercept::config((CLIntercept *)local_48), (pSVar4->NoErrors & 1U) != 0)) &&
       ((int)in_stack_00000018->m_ProcessId != 0)) {
      pSVar4 = CLIntercept::config((CLIntercept *)local_48);
      if ((pSVar4->ErrorLogging & 1U) != 0) {
        CLIntercept::logError(in_stack_00000070,in_stack_00000068,in_stack_00000064);
      }
      pSVar4 = CLIntercept::config((CLIntercept *)local_48);
      if ((pSVar4->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar4 = CLIntercept::config((CLIntercept *)local_48);
      if ((pSVar4->NoErrors & 1U) != 0) {
        *(cl_int *)&in_stack_00000018->m_ProcessId = 0;
      }
    }
    pSVar4 = CLIntercept::config((CLIntercept *)local_48);
    if ((pSVar4->BuildLogging & 1U) != 0) {
      in_stack_ffffffffffffff10.__d.__r = (duration)(duration)local_70;
      CLIntercept::logBuild
                (in_stack_00000278,in_stack_00000280,in_stack_00000270,in_stack_0000026c,
                 in_stack_00000260);
    }
    pSVar4 = CLIntercept::config((CLIntercept *)local_48);
    if ((pSVar4->LeakChecking & 1U) != 0) {
      CLIntercept::objectTracker((CLIntercept *)local_48);
      CObjectTracker::AddAllocation<_cl_program*>
                (in_stack_fffffffffffffe68,(_cl_program *)in_stack_fffffffffffffe60);
    }
    pSVar4 = CLIntercept::config((CLIntercept *)local_48);
    if ((pSVar4->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                ((CLIntercept *)local_48,"clLinkProgram",
                 (cl_int)(ulong)(uint)in_stack_00000018->m_ProcessId,(cl_event *)0x0,
                 (cl_sync_point_khr *)0x0,"returned %p",local_98);
    }
    pSVar4 = CLIntercept::config((CLIntercept *)local_48);
    if ((pSVar4->ChromeCallLogging & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffef0,"",(allocator *)&stack0xfffffffffffffeef);
      local_128 = (rep)local_88.__d.__r;
      CLIntercept::chromeCallLoggingExit
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                 (bool)in_stack_fffffffffffffeef,(uint64_t)local_80.__d.__r,
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeef);
    }
    CLIntercept::saveProgramNumber(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    pSVar4 = CLIntercept::config((CLIntercept *)local_48);
    if ((((((pSVar4->BuildLogging & 1U) != 0) ||
          (pSVar4 = CLIntercept::config((CLIntercept *)local_48),
          (pSVar4->KernelNameHashTracking & 1U) != 0)) ||
         ((pSVar4 = CLIntercept::config((CLIntercept *)local_48),
          (pSVar4->DumpProgramSource & 1U) != 0 ||
          ((pSVar4 = CLIntercept::config((CLIntercept *)local_48),
           (pSVar4->DumpInputProgramBinaries & 1U) != 0 ||
           (pSVar4 = CLIntercept::config((CLIntercept *)local_48),
           (pSVar4->DumpProgramBinaries & 1U) != 0)))))) ||
        (pSVar4 = CLIntercept::config((CLIntercept *)local_48), (pSVar4->DumpProgramSPIRV & 1U) != 0
        )) || ((((pSVar4 = CLIntercept::config((CLIntercept *)local_48),
                 (pSVar4->DumpProgramBuildLogs & 1U) != 0 ||
                 (pSVar4 = CLIntercept::config((CLIntercept *)local_48),
                 (pSVar4->DumpKernelISABinaries & 1U) != 0)) ||
                (pSVar4 = CLIntercept::config((CLIntercept *)local_48),
                (pSVar4->InjectProgramSource & 1U) != 0)) ||
               ((pSVar4 = CLIntercept::config((CLIntercept *)local_48),
                (pSVar4->AutoCreateSPIRV & 1U) != 0 ||
                (pSVar4 = CLIntercept::config((CLIntercept *)local_48),
                (pSVar4->AubCaptureUniqueKernels & 1U) != 0)))))) {
      CLIntercept::saveProgramOptionsHash
                ((CLIntercept *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                 in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90);
    }
    pSVar4 = CLIntercept::config((CLIntercept *)local_48);
    if ((((pSVar4->DumpProgramSource & 1U) == 0) &&
        (pSVar4 = CLIntercept::config((CLIntercept *)local_48),
        (pSVar4->DumpInputProgramBinaries & 1U) == 0)) &&
       ((pSVar4 = CLIntercept::config((CLIntercept *)local_48),
        (pSVar4->DumpProgramBinaries & 1U) == 0 &&
        (pSVar4 = CLIntercept::config((CLIntercept *)local_48), (pSVar4->DumpProgramSPIRV & 1U) == 0
        )))) {
      if (((local_61 & 1) == 0) &&
         ((pSVar4 = CLIntercept::config((CLIntercept *)local_48),
          (pSVar4->SimpleDumpProgramSource & 1U) != 0 ||
          (pSVar4 = CLIntercept::config((CLIntercept *)local_48),
          (pSVar4->DumpProgramSourceScript & 1U) != 0)))) {
        in_stack_fffffffffffffe70 = in_RCX;
        if ((CLIntercept *)local_60 != (CLIntercept *)0x0) {
          in_stack_fffffffffffffe70 = local_60;
        }
        CLIntercept::dumpProgramOptionsScript
                  (in_stack_fffffffffffffe60,(cl_program)in_stack_fffffffffffffe58,
                   (char *)in_stack_fffffffffffffe50);
      }
    }
    else {
      CLIntercept::dumpProgramOptions
                (in_stack_000000a0,in_stack_00000098,in_stack_00000097,in_stack_00000090,
                 in_stack_0000008c,in_stack_00000080);
    }
    pSVar4 = CLIntercept::config((CLIntercept *)local_48);
    if ((pSVar4->DumpProgramBinaries & 1U) != 0) {
      CLIntercept::dumpProgramBinary(_localErrorCode,(cl_program)buildTimeStart.__d.__r);
    }
    pSVar4 = CLIntercept::config((CLIntercept *)local_48);
    if ((pSVar4->DumpKernelISABinaries & 1U) != 0) {
      CLIntercept::dumpKernelISABinaries((CLIntercept *)cpuEnd.__d.__r,in_stack_00000128);
    }
    if ((local_98 != (cl_program)0x0) &&
       (((((((pSVar4 = CLIntercept::config((CLIntercept *)local_48),
             (pSVar4->BuildLogging & 1U) != 0 ||
             (pSVar4 = CLIntercept::config((CLIntercept *)local_48),
             (pSVar4->KernelNameHashTracking & 1U) != 0)) ||
            (pSVar4 = CLIntercept::config((CLIntercept *)local_48),
            (pSVar4->InjectProgramSource & 1U) != 0)) ||
           ((pSVar4 = CLIntercept::config((CLIntercept *)local_48),
            (pSVar4->DumpProgramSourceScript & 1U) != 0 ||
            (pSVar4 = CLIntercept::config((CLIntercept *)local_48),
            (pSVar4->DumpProgramSource & 1U) != 0)))) ||
          ((pSVar4 = CLIntercept::config((CLIntercept *)local_48),
           (pSVar4->DumpProgramBinaries & 1U) != 0 ||
           ((pSVar4 = CLIntercept::config((CLIntercept *)local_48),
            (pSVar4->DumpProgramSPIRV & 1U) != 0 ||
            (pSVar4 = CLIntercept::config((CLIntercept *)local_48),
            (pSVar4->DumpProgramBuildLogs & 1U) != 0)))))) ||
         (pSVar4 = CLIntercept::config((CLIntercept *)local_48),
         (pSVar4->DumpKernelISABinaries & 1U) != 0)) ||
        ((pSVar4 = CLIntercept::config((CLIntercept *)local_48), (pSVar4->AutoCreateSPIRV & 1U) != 0
         || (pSVar4 = CLIntercept::config((CLIntercept *)local_48),
            (pSVar4->AubCaptureUniqueKernels & 1U) != 0)))))) {
      CLIntercept::incrementProgramCompileCount
                ((CLIntercept *)in_stack_fffffffffffffe70,(cl_program)in_stack_fffffffffffffe68);
    }
    if ((CLIntercept *)local_60 != (CLIntercept *)0x0) {
      operator_delete__((void *)local_60);
    }
  }
  return local_98;
}

Assistant:

CL_API_ENTRY cl_program CL_API_CALL CLIRN(clLinkProgram)(
    cl_context context,
    cl_uint num_devices,
    const cl_device_id* device_list,
    const char* options,
    cl_uint num_input_programs,
    const cl_program* input_programs,
    void (CL_CALLBACK *pfn_notify)(cl_program program, void* user_data),
    void* user_data,
    cl_int* errcode_ret )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clLinkProgram )
    {
        GET_ENQUEUE_COUNTER();

        const bool isCompile = false;
        const bool isLink = true;
        char*   newOptions = NULL;

        PROGRAM_LINK_OPTIONS_OVERRIDE_INIT( num_devices, device_list, options, newOptions );

        CALL_LOGGING_ENTER( "context = %p, num_input_programs = %u, pfn_notify = %p",
            context,
            num_input_programs,
            pfn_notify );
        CHECK_ERROR_INIT( errcode_ret );
        BUILD_LOGGING_INIT();
        HOST_PERFORMANCE_TIMING_START();

        cl_program  retVal = NULL;

        if( newOptions != NULL )
        {
            retVal = pIntercept->dispatch().clLinkProgram(
                context,
                num_devices,
                device_list,
                newOptions,
                num_input_programs,
                input_programs,
                pfn_notify,
                user_data,
                errcode_ret );
        }

        if( retVal == NULL )
        {
            retVal = pIntercept->dispatch().clLinkProgram(
                context,
                num_devices,
                device_list,
                options,
                num_input_programs,
                input_programs,
                pfn_notify,
                user_data,
                errcode_ret );
        }

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( errcode_ret[0] );
        BUILD_LOGGING( retVal, num_devices, device_list );
        ADD_OBJECT_ALLOCATION( retVal );
        CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

        // TODO: How do we compute a hash for the linked program?
        // This is a new program object, so we don't currently have a hash for it.
        SAVE_PROGRAM_NUMBER( retVal );
        SAVE_PROGRAM_OPTIONS_HASH( retVal, options );
        DUMP_PROGRAM_OPTIONS( retVal, newOptions ? newOptions : options, isCompile, isLink );
        DUMP_OUTPUT_PROGRAM_BINARIES( retVal );
        DUMP_KERNEL_ISA_BINARIES( retVal );
        INCREMENT_PROGRAM_COMPILE_COUNT( retVal );
        PROGRAM_OPTIONS_CLEANUP( newOptions );

        return retVal;
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}